

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.cc
# Opt level: O3

size_t __thiscall
google::protobuf::Message::ComputeUnknownFieldsSize
          (Message *this,size_t total_size,CachedSize *cached_size)

{
  ulong uVar1;
  int iVar2;
  size_t sVar3;
  UnknownFieldSet *unknown_fields;
  
  uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) == 0) {
    unknown_fields = (UnknownFieldSet *)&UnknownFieldSet::default_instance()::instance;
  }
  else {
    unknown_fields = (UnknownFieldSet *)((uVar1 & 0xfffffffffffffffe) + 8);
  }
  sVar3 = internal::WireFormat::ComputeUnknownFieldsSize(unknown_fields);
  iVar2 = (int)(sVar3 + total_size);
  if ((iVar2 != 0) || (cached_size->atom_ != 0)) {
    cached_size->atom_ = iVar2;
  }
  return sVar3 + total_size;
}

Assistant:

size_t Message::ComputeUnknownFieldsSize(
    size_t total_size, const internal::CachedSize* cached_size) const {
  total_size += WireFormat::ComputeUnknownFieldsSize(
      _internal_metadata_.unknown_fields<UnknownFieldSet>(
          UnknownFieldSet::default_instance));
  cached_size->Set(internal::ToCachedSize(total_size));
  return total_size;
}